

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMvIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  int iVar2;
  float fVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  byte bVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  int iVar24;
  int iVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  byte bVar29;
  byte bVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  bool bVar39;
  ulong uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined4 uVar59;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [64];
  float fVar64;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar65 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [64];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar77 [32];
  float fVar81;
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  RTCFilterFunctionNArguments args;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  long lStack_2848;
  byte local_2838;
  undefined1 local_2810 [16];
  ulong local_27f8;
  ulong local_27f0;
  ulong *local_27e8;
  Scene *local_27e0;
  long local_27d8;
  RTCFilterFunctionNArguments local_27d0;
  undefined1 local_27a0 [32];
  undefined1 local_2770 [16];
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  RTCHitN local_2730 [16];
  undefined1 local_2720 [16];
  undefined1 local_2710 [16];
  undefined1 local_2700 [16];
  undefined4 local_26f0;
  undefined4 uStack_26ec;
  undefined4 uStack_26e8;
  undefined4 uStack_26e4;
  undefined1 local_26e0 [16];
  undefined1 local_26d0 [16];
  uint local_26c0;
  uint uStack_26bc;
  uint uStack_26b8;
  uint uStack_26b4;
  uint uStack_26b0;
  uint uStack_26ac;
  uint uStack_26a8;
  uint uStack_26a4;
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  byte local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0;
  size_t local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  undefined1 auVar46 [32];
  
  local_27e8 = local_2390;
  local_23a0 = root.ptr;
  local_2398[0] = 0;
  auVar42 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar83 = ZEXT3264(auVar42);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar84 = ZEXT3264(auVar43);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar85 = ZEXT3264(auVar44);
  auVar41 = vmulss_avx512f(auVar42._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  uVar59 = auVar41._0_4_;
  auVar45._4_4_ = uVar59;
  auVar45._0_4_ = uVar59;
  auVar45._8_4_ = uVar59;
  auVar45._12_4_ = uVar59;
  auVar45._16_4_ = uVar59;
  auVar45._20_4_ = uVar59;
  auVar45._24_4_ = uVar59;
  auVar45._28_4_ = uVar59;
  auVar41 = vmulss_avx512f(auVar43._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  uVar59 = auVar41._0_4_;
  auVar46._4_4_ = uVar59;
  auVar46._0_4_ = uVar59;
  auVar46._8_4_ = uVar59;
  auVar46._12_4_ = uVar59;
  auVar46._16_4_ = uVar59;
  auVar46._20_4_ = uVar59;
  auVar46._24_4_ = uVar59;
  auVar46._28_4_ = uVar59;
  auVar41 = vmulss_avx512f(auVar44._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar59 = auVar41._0_4_;
  auVar44._4_4_ = uVar59;
  auVar44._0_4_ = uVar59;
  auVar44._8_4_ = uVar59;
  auVar44._12_4_ = uVar59;
  auVar44._16_4_ = uVar59;
  auVar44._20_4_ = uVar59;
  auVar44._24_4_ = uVar59;
  auVar44._28_4_ = uVar59;
  local_27f0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_27f8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar35 = local_27f0 ^ 0x20;
  uVar38 = local_27f8 ^ 0x20;
  iVar2 = (tray->tfar).field_0.i[k];
  auVar63 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(iVar2
                                                  ,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar86 = ZEXT3264(auVar42);
  auVar43 = vxorps_avx512vl(auVar45,auVar42);
  auVar87 = ZEXT3264(auVar43);
  auVar43 = vxorps_avx512vl(auVar46,auVar42);
  auVar88 = ZEXT3264(auVar43);
  auVar42 = vxorps_avx512vl(auVar44,auVar42);
  auVar89 = ZEXT3264(auVar42);
  auVar42 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar90 = ZEXT3264(auVar42);
  auVar41 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar91 = ZEXT1664(auVar41);
  auVar42 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
  auVar92 = ZEXT3264(auVar42);
  auVar42 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
  auVar93 = ZEXT3264(auVar42);
  auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
  auVar94 = ZEXT1664(auVar41);
LAB_01da52f4:
  do {
    if (local_27e8 == &local_23a0) {
      return;
    }
    pfVar1 = (float *)(local_27e8 + -1);
    local_27e8 = local_27e8 + -2;
  } while (*(float *)(ray + k * 4 + 0x80) < *pfVar1);
  uVar36 = *local_27e8;
LAB_01da5316:
  do {
    if ((uVar36 & 8) != 0) break;
    auVar42 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(uVar36 + 0x40 + local_27f0),auVar87._0_32_,
                         auVar83._0_32_);
    auVar43 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(uVar36 + 0x40 + local_27f8),auVar88._0_32_,
                         auVar84._0_32_);
    auVar42 = vpmaxsd_avx2(auVar42,auVar43);
    auVar43 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(uVar36 + 0x40 + uVar33),auVar89._0_32_,
                         auVar85._0_32_);
    auVar43 = vpmaxsd_avx512vl(auVar43,auVar90._0_32_);
    auVar42 = vpmaxsd_avx2(auVar42,auVar43);
    auVar43 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(uVar36 + 0x40 + uVar35),auVar87._0_32_,
                         auVar83._0_32_);
    auVar44 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(uVar36 + 0x40 + uVar38),auVar88._0_32_,
                         auVar84._0_32_);
    auVar43 = vpminsd_avx2(auVar43,auVar44);
    auVar44 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(uVar36 + 0x40 + (uVar33 ^ 0x20)),auVar89._0_32_,
                         auVar85._0_32_);
    auVar44 = vpminsd_avx2(auVar44,auVar63._0_32_);
    auVar43 = vpminsd_avx2(auVar43,auVar44);
    uVar37 = vpcmpd_avx512vl(auVar42,auVar43,2);
    bVar30 = (byte)uVar37;
    if (bVar30 == 0) goto LAB_01da52f4;
    auVar43 = *(undefined1 (*) [32])(uVar36 & 0xfffffffffffffff0);
    auVar44 = ((undefined1 (*) [32])(uVar36 & 0xfffffffffffffff0))[1];
    auVar45 = vmovdqa64_avx512vl(auVar92._0_32_);
    auVar45 = vpternlogd_avx512vl(auVar45,auVar42,auVar93._0_32_,0xf8);
    auVar46 = vpcompressd_avx512vl(auVar45);
    auVar47._0_4_ = (uint)(bVar30 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar45._0_4_;
    bVar39 = (bool)((byte)(uVar37 >> 1) & 1);
    auVar47._4_4_ = (uint)bVar39 * auVar46._4_4_ | (uint)!bVar39 * auVar45._4_4_;
    bVar39 = (bool)((byte)(uVar37 >> 2) & 1);
    auVar47._8_4_ = (uint)bVar39 * auVar46._8_4_ | (uint)!bVar39 * auVar45._8_4_;
    bVar39 = (bool)((byte)(uVar37 >> 3) & 1);
    auVar47._12_4_ = (uint)bVar39 * auVar46._12_4_ | (uint)!bVar39 * auVar45._12_4_;
    bVar39 = (bool)((byte)(uVar37 >> 4) & 1);
    auVar47._16_4_ = (uint)bVar39 * auVar46._16_4_ | (uint)!bVar39 * auVar45._16_4_;
    bVar39 = (bool)((byte)(uVar37 >> 5) & 1);
    auVar47._20_4_ = (uint)bVar39 * auVar46._20_4_ | (uint)!bVar39 * auVar45._20_4_;
    bVar39 = (bool)((byte)(uVar37 >> 6) & 1);
    auVar47._24_4_ = (uint)bVar39 * auVar46._24_4_ | (uint)!bVar39 * auVar45._24_4_;
    bVar39 = SUB81(uVar37 >> 7,0);
    auVar47._28_4_ = (uint)bVar39 * auVar46._28_4_ | (uint)!bVar39 * auVar45._28_4_;
    auVar45 = vpermt2q_avx512vl(auVar43,auVar47,auVar44);
    uVar36 = auVar45._0_8_;
    bVar30 = bVar30 - 1 & bVar30;
    if (bVar30 != 0) {
      auVar45 = vpshufd_avx2(auVar47,0x55);
      vpermt2q_avx512vl(auVar43,auVar45,auVar44);
      auVar46 = vpminsd_avx2(auVar47,auVar45);
      auVar45 = vpmaxsd_avx2(auVar47,auVar45);
      bVar30 = bVar30 - 1 & bVar30;
      if (bVar30 == 0) {
        auVar46 = vpermi2q_avx512vl(auVar46,auVar43,auVar44);
        uVar36 = auVar46._0_8_;
        auVar43 = vpermt2q_avx512vl(auVar43,auVar45,auVar44);
        *local_27e8 = auVar43._0_8_;
        lVar27 = 8;
        lStack_2848 = 0x10;
        auVar53 = auVar45;
      }
      else {
        auVar53 = vpshufd_avx2(auVar47,0xaa);
        vpermt2q_avx512vl(auVar43,auVar53,auVar44);
        auVar52 = vpminsd_avx2(auVar46,auVar53);
        auVar46 = vpmaxsd_avx2(auVar46,auVar53);
        auVar53 = vpminsd_avx2(auVar45,auVar46);
        auVar45 = vpmaxsd_avx2(auVar45,auVar46);
        bVar30 = bVar30 - 1 & bVar30;
        if (bVar30 == 0) {
          auVar46 = vpermi2q_avx512vl(auVar52,auVar43,auVar44);
          uVar36 = auVar46._0_8_;
          auVar46 = vpermt2q_avx512vl(auVar43,auVar45,auVar44);
          *local_27e8 = auVar46._0_8_;
          auVar45 = vpermd_avx2(auVar45,auVar42);
          *(int *)(local_27e8 + 1) = auVar45._0_4_;
          auVar43 = vpermt2q_avx512vl(auVar43,auVar53,auVar44);
          local_27e8[2] = auVar43._0_8_;
          lStack_2848 = 0x18;
          lVar27 = lStack_2848;
          lStack_2848 = 0x20;
        }
        else {
          auVar46 = vpshufd_avx2(auVar47,0xff);
          vpermt2q_avx512vl(auVar43,auVar46,auVar44);
          auVar51 = vpminsd_avx2(auVar52,auVar46);
          auVar46 = vpmaxsd_avx2(auVar52,auVar46);
          auVar52 = vpminsd_avx2(auVar53,auVar46);
          auVar46 = vpmaxsd_avx2(auVar53,auVar46);
          auVar53 = vpminsd_avx2(auVar45,auVar46);
          auVar45 = vpmaxsd_avx2(auVar45,auVar46);
          bVar30 = bVar30 - 1 & bVar30;
          if (bVar30 != 0) {
            auVar48 = valignd_avx512vl(auVar47,auVar47,3);
            auVar49 = vmovdqa64_avx512vl(auVar94._0_32_);
            auVar50 = vmovdqa64_avx512vl(auVar94._0_32_);
            auVar46 = vpmovsxbd_avx2(ZEXT816(0x303020108));
            auVar51 = vpermt2d_avx512vl(auVar50,auVar46,auVar51);
            auVar46 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
            auVar52 = vpermt2d_avx512vl(auVar51,auVar46,auVar52);
            auVar52 = vpermt2d_avx512vl(auVar52,auVar46,auVar53);
            auVar46 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
            auVar45 = vpermt2d_avx512vl(auVar52,auVar46,auVar45);
            auVar94 = ZEXT3264(auVar45);
            bVar29 = bVar30;
            do {
              auVar46 = auVar94._0_32_;
              auVar70._8_4_ = 1;
              auVar70._0_8_ = 0x100000001;
              auVar70._12_4_ = 1;
              auVar70._16_4_ = 1;
              auVar70._20_4_ = 1;
              auVar70._24_4_ = 1;
              auVar70._28_4_ = 1;
              auVar45 = vpermd_avx2(auVar70,auVar48);
              auVar48 = valignd_avx512vl(auVar48,auVar48,1);
              vpermt2q_avx512vl(auVar43,auVar48,auVar44);
              bVar29 = bVar29 - 1 & bVar29;
              uVar18 = vpcmpd_avx512vl(auVar45,auVar46,5);
              auVar45 = vpmaxsd_avx2(auVar45,auVar46);
              bVar19 = (byte)uVar18 << 1;
              auVar46 = valignd_avx512vl(auVar46,auVar46,7);
              bVar39 = (bool)((byte)uVar18 & 1);
              bVar10 = (bool)(bVar19 >> 2 & 1);
              bVar11 = (bool)(bVar19 >> 3 & 1);
              bVar12 = (bool)(bVar19 >> 4 & 1);
              bVar13 = (bool)(bVar19 >> 5 & 1);
              bVar14 = (bool)(bVar19 >> 6 & 1);
              auVar94 = ZEXT3264(CONCAT428((uint)(bVar19 >> 7) * auVar46._28_4_ |
                                           (uint)!(bool)(bVar19 >> 7) * auVar45._28_4_,
                                           CONCAT424((uint)bVar14 * auVar46._24_4_ |
                                                     (uint)!bVar14 * auVar45._24_4_,
                                                     CONCAT420((uint)bVar13 * auVar46._20_4_ |
                                                               (uint)!bVar13 * auVar45._20_4_,
                                                               CONCAT416((uint)bVar12 *
                                                                         auVar46._16_4_ |
                                                                         (uint)!bVar12 *
                                                                         auVar45._16_4_,
                                                                         CONCAT412((uint)bVar11 *
                                                                                   auVar46._12_4_ |
                                                                                   (uint)!bVar11 *
                                                                                   auVar45._12_4_,
                                                                                   CONCAT48((uint)
                                                  bVar10 * auVar46._8_4_ |
                                                  (uint)!bVar10 * auVar45._8_4_,
                                                  CONCAT44((uint)bVar39 * auVar46._4_4_ |
                                                           (uint)!bVar39 * auVar45._4_4_,
                                                           auVar45._0_4_))))))));
            } while (bVar29 != 0);
            lVar27 = (ulong)(uint)POPCOUNT((uint)bVar30) + 3;
            while( true ) {
              auVar46 = auVar94._0_32_;
              auVar45 = vpermt2q_avx512vl(auVar43,auVar46,auVar44);
              uVar36 = auVar45._0_8_;
              bVar39 = lVar27 == 0;
              lVar27 = lVar27 + -1;
              if (bVar39) break;
              *local_27e8 = uVar36;
              auVar45 = vpermd_avx2(auVar46,auVar42);
              *(int *)(local_27e8 + 1) = auVar45._0_4_;
              auVar45 = valignd_avx512vl(auVar46,auVar46,1);
              auVar94 = ZEXT3264(auVar45);
              local_27e8 = local_27e8 + 2;
            }
            auVar42 = vmovdqa64_avx512vl(auVar49);
            auVar94 = ZEXT3264(auVar42);
            goto LAB_01da5316;
          }
          auVar46 = vpermi2q_avx512vl(auVar51,auVar43,auVar44);
          uVar36 = auVar46._0_8_;
          auVar46 = vpermt2q_avx512vl(auVar43,auVar45,auVar44);
          *local_27e8 = auVar46._0_8_;
          auVar45 = vpermd_avx2(auVar45,auVar42);
          *(int *)(local_27e8 + 1) = auVar45._0_4_;
          auVar45 = vpermt2q_avx512vl(auVar43,auVar53,auVar44);
          local_27e8[2] = auVar45._0_8_;
          auVar45 = vpermd_avx2(auVar53,auVar42);
          *(int *)(local_27e8 + 3) = auVar45._0_4_;
          auVar43 = vpermt2q_avx512vl(auVar43,auVar52,auVar44);
          local_27e8[4] = auVar43._0_8_;
          lStack_2848 = 0x28;
          lVar27 = lStack_2848;
          lStack_2848 = 0x30;
          auVar53 = auVar52;
        }
      }
      auVar42 = vpermd_avx2(auVar53,auVar42);
      *(int *)((long)local_27e8 + lVar27) = auVar42._0_4_;
      local_27e8 = (ulong *)((long)local_27e8 + lStack_2848);
    }
  } while( true );
  uVar37 = uVar36 & 0xfffffffffffffff0;
  for (local_27d8 = 0; local_27d8 != (ulong)((uint)uVar36 & 0xf) - 8; local_27d8 = local_27d8 + 1) {
    lVar28 = local_27d8 * 0xe0;
    lVar27 = uVar37 + 0xd0 + lVar28;
    local_2760 = *(undefined8 *)(lVar27 + 0x10);
    uStack_2758 = *(undefined8 *)(lVar27 + 0x18);
    lVar27 = uVar37 + 0xc0 + lVar28;
    local_25a0 = *(undefined8 *)(lVar27 + 0x10);
    uStack_2598 = *(undefined8 *)(lVar27 + 0x18);
    uStack_2590 = local_25a0;
    uStack_2588 = uStack_2598;
    uStack_2750 = local_2760;
    uStack_2748 = uStack_2758;
    auVar56._16_16_ = *(undefined1 (*) [16])(uVar37 + 0x60 + lVar28);
    auVar56._0_16_ = *(undefined1 (*) [16])(uVar37 + lVar28);
    auVar69._16_16_ = *(undefined1 (*) [16])(uVar37 + 0x70 + lVar28);
    auVar69._0_16_ = *(undefined1 (*) [16])(uVar37 + 0x10 + lVar28);
    auVar71._16_16_ = *(undefined1 (*) [16])(uVar37 + 0x80 + lVar28);
    auVar71._0_16_ = *(undefined1 (*) [16])(uVar37 + 0x20 + lVar28);
    auVar41 = *(undefined1 (*) [16])(uVar37 + 0x30 + lVar28);
    auVar42._16_16_ = auVar41;
    auVar42._0_16_ = auVar41;
    auVar5 = *(undefined1 (*) [16])(uVar37 + 0x40 + lVar28);
    auVar43._16_16_ = auVar5;
    auVar43._0_16_ = auVar5;
    auVar6 = *(undefined1 (*) [16])(uVar37 + 0x50 + lVar28);
    auVar52._16_16_ = auVar6;
    auVar52._0_16_ = auVar6;
    auVar7 = *(undefined1 (*) [16])(uVar37 + 0x90 + lVar28);
    auVar72._16_16_ = auVar7;
    auVar72._0_16_ = auVar7;
    auVar7 = *(undefined1 (*) [16])(uVar37 + 0xa0 + lVar28);
    auVar73._16_16_ = auVar7;
    auVar73._0_16_ = auVar7;
    auVar7 = *(undefined1 (*) [16])(uVar37 + 0xb0 + lVar28);
    auVar75._16_16_ = auVar7;
    auVar75._0_16_ = auVar7;
    auVar42 = vsubps_avx(auVar56,auVar42);
    auVar43 = vsubps_avx(auVar69,auVar43);
    auVar44 = vsubps_avx(auVar71,auVar52);
    auVar45 = vsubps_avx(auVar72,auVar56);
    auVar46 = vsubps_avx(auVar73,auVar69);
    auVar52 = vsubps_avx(auVar75,auVar71);
    auVar48._4_4_ = auVar43._4_4_ * auVar52._4_4_;
    auVar48._0_4_ = auVar43._0_4_ * auVar52._0_4_;
    auVar48._8_4_ = auVar43._8_4_ * auVar52._8_4_;
    auVar48._12_4_ = auVar43._12_4_ * auVar52._12_4_;
    auVar48._16_4_ = auVar43._16_4_ * auVar52._16_4_;
    auVar48._20_4_ = auVar43._20_4_ * auVar52._20_4_;
    auVar48._24_4_ = auVar43._24_4_ * auVar52._24_4_;
    auVar48._28_4_ = auVar41._12_4_;
    auVar7 = vfmsub231ps_fma(auVar48,auVar46,auVar44);
    auVar54._4_4_ = auVar44._4_4_ * auVar45._4_4_;
    auVar54._0_4_ = auVar44._0_4_ * auVar45._0_4_;
    auVar54._8_4_ = auVar44._8_4_ * auVar45._8_4_;
    auVar54._12_4_ = auVar44._12_4_ * auVar45._12_4_;
    auVar54._16_4_ = auVar44._16_4_ * auVar45._16_4_;
    auVar54._20_4_ = auVar44._20_4_ * auVar45._20_4_;
    auVar54._24_4_ = auVar44._24_4_ * auVar45._24_4_;
    auVar54._28_4_ = auVar5._12_4_;
    auVar5 = vfmsub231ps_fma(auVar54,auVar52,auVar42);
    auVar55._4_4_ = auVar42._4_4_ * auVar46._4_4_;
    auVar55._0_4_ = auVar42._0_4_ * auVar46._0_4_;
    auVar55._8_4_ = auVar42._8_4_ * auVar46._8_4_;
    auVar55._12_4_ = auVar42._12_4_ * auVar46._12_4_;
    auVar55._16_4_ = auVar42._16_4_ * auVar46._16_4_;
    auVar55._20_4_ = auVar42._20_4_ * auVar46._20_4_;
    auVar55._24_4_ = auVar42._24_4_ * auVar46._24_4_;
    auVar55._28_4_ = auVar6._12_4_;
    uVar59 = *(undefined4 *)(ray + k * 4 + 0x40);
    auVar77._4_4_ = uVar59;
    auVar77._0_4_ = uVar59;
    auVar77._8_4_ = uVar59;
    auVar77._12_4_ = uVar59;
    auVar77._16_4_ = uVar59;
    auVar77._20_4_ = uVar59;
    auVar77._24_4_ = uVar59;
    auVar77._28_4_ = uVar59;
    auVar50 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
    auVar48 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
    uVar59 = *(undefined4 *)(ray + k * 4);
    auVar53._4_4_ = uVar59;
    auVar53._0_4_ = uVar59;
    auVar53._8_4_ = uVar59;
    auVar53._12_4_ = uVar59;
    auVar53._16_4_ = uVar59;
    auVar53._20_4_ = uVar59;
    auVar53._24_4_ = uVar59;
    auVar53._28_4_ = uVar59;
    auVar53 = vsubps_avx512vl(auVar56,auVar53);
    auVar6 = vfmsub231ps_fma(auVar55,auVar45,auVar43);
    uVar59 = *(undefined4 *)(ray + k * 4 + 0x10);
    auVar51._4_4_ = uVar59;
    auVar51._0_4_ = uVar59;
    auVar51._8_4_ = uVar59;
    auVar51._12_4_ = uVar59;
    auVar51._16_4_ = uVar59;
    auVar51._20_4_ = uVar59;
    auVar51._24_4_ = uVar59;
    auVar51._28_4_ = uVar59;
    auVar51 = vsubps_avx512vl(auVar69,auVar51);
    uVar59 = *(undefined4 *)(ray + k * 4 + 0x20);
    auVar49._4_4_ = uVar59;
    auVar49._0_4_ = uVar59;
    auVar49._8_4_ = uVar59;
    auVar49._12_4_ = uVar59;
    auVar49._16_4_ = uVar59;
    auVar49._20_4_ = uVar59;
    auVar49._24_4_ = uVar59;
    auVar49._28_4_ = uVar59;
    auVar49 = vsubps_avx512vl(auVar71,auVar49);
    auVar54 = vmulps_avx512vl(auVar50,auVar49);
    auVar54 = vfmsub231ps_avx512vl(auVar54,auVar51,auVar48);
    auVar55 = vmulps_avx512vl(auVar48,auVar53);
    auVar55 = vfmsub231ps_avx512vl(auVar55,auVar49,auVar77);
    auVar56 = vmulps_avx512vl(auVar77,auVar51);
    auVar56 = vfmsub231ps_avx512vl(auVar56,auVar53,auVar50);
    auVar48 = vmulps_avx512vl(ZEXT1632(auVar6),auVar48);
    auVar50 = vfmadd231ps_avx512vl(auVar48,ZEXT1632(auVar5),auVar50);
    local_2520 = vfmadd231ps_avx512vl(auVar50,ZEXT1632(auVar7),auVar77);
    auVar50._8_4_ = 0x7fffffff;
    auVar50._0_8_ = 0x7fffffff7fffffff;
    auVar50._12_4_ = 0x7fffffff;
    auVar50._16_4_ = 0x7fffffff;
    auVar50._20_4_ = 0x7fffffff;
    auVar50._24_4_ = 0x7fffffff;
    auVar50._28_4_ = 0x7fffffff;
    vandps_avx512vl(local_2520,auVar50);
    vandps_avx512vl(local_2520,auVar86._0_32_);
    auVar52 = vmulps_avx512vl(auVar52,auVar56);
    auVar46 = vfmadd231ps_avx512vl(auVar52,auVar55,auVar46);
    auVar41 = vfmadd231ps_fma(auVar46,auVar54,auVar45);
    fVar64 = local_2520._0_4_;
    local_2580._0_4_ = (float)((uint)fVar64 ^ auVar41._0_4_);
    fVar66 = local_2520._4_4_;
    local_2580._4_4_ = (float)((uint)fVar66 ^ auVar41._4_4_);
    fVar67 = local_2520._8_4_;
    local_2580._8_4_ = (float)((uint)fVar67 ^ auVar41._8_4_);
    fVar68 = local_2520._12_4_;
    local_2580._12_4_ = (float)((uint)fVar68 ^ auVar41._12_4_);
    fVar78 = local_2520._16_4_;
    local_2580._16_4_ = fVar78;
    fVar79 = local_2520._20_4_;
    local_2580._20_4_ = fVar79;
    fVar80 = local_2520._24_4_;
    local_2580._24_4_ = fVar80;
    fVar81 = local_2520._28_4_;
    local_2580._28_4_ = fVar81;
    auVar44 = vmulps_avx512vl(auVar44,auVar56);
    auVar43 = vfmadd231ps_avx512vl(auVar44,auVar43,auVar55);
    auVar41 = vfmadd231ps_fma(auVar43,auVar42,auVar54);
    local_2560._0_4_ = (float)((uint)fVar64 ^ auVar41._0_4_);
    local_2560._4_4_ = (float)((uint)fVar66 ^ auVar41._4_4_);
    local_2560._8_4_ = (float)((uint)fVar67 ^ auVar41._8_4_);
    local_2560._12_4_ = (float)((uint)fVar68 ^ auVar41._12_4_);
    local_2560._16_4_ = fVar78;
    local_2560._20_4_ = fVar79;
    local_2560._24_4_ = fVar80;
    local_2560._28_4_ = fVar81;
    uVar18 = vcmpps_avx512vl(local_2580,ZEXT832(0) << 0x20,5);
    uVar15 = vcmpps_avx512vl(local_2560,ZEXT832(0) << 0x20,5);
    uVar16 = vcmpps_avx512vl(local_2520,ZEXT832(0) << 0x20,4);
    auVar82._0_4_ = local_2580._0_4_ + local_2560._0_4_;
    auVar82._4_4_ = local_2580._4_4_ + local_2560._4_4_;
    auVar82._8_4_ = local_2580._8_4_ + local_2560._8_4_;
    auVar82._12_4_ = local_2580._12_4_ + local_2560._12_4_;
    auVar82._16_4_ = fVar78 + fVar78;
    auVar82._20_4_ = fVar79 + fVar79;
    auVar82._24_4_ = fVar80 + fVar80;
    auVar82._28_4_ = fVar81 + fVar81;
    uVar17 = vcmpps_avx512vl(auVar82,local_2520,2);
    local_24a0 = (byte)uVar18 & (byte)uVar15 & (byte)uVar16 & (byte)uVar17;
    if (local_24a0 != 0) {
      auVar21._4_4_ = auVar49._4_4_ * auVar6._4_4_;
      auVar21._0_4_ = auVar49._0_4_ * auVar6._0_4_;
      auVar21._8_4_ = auVar49._8_4_ * auVar6._8_4_;
      auVar21._12_4_ = auVar49._12_4_ * auVar6._12_4_;
      auVar21._16_4_ = auVar49._16_4_ * 0.0;
      auVar21._20_4_ = auVar49._20_4_ * 0.0;
      auVar21._24_4_ = auVar49._24_4_ * 0.0;
      auVar21._28_4_ = auVar49._28_4_;
      auVar41 = vfmadd213ps_fma(auVar51,ZEXT1632(auVar5),auVar21);
      auVar41 = vfmadd213ps_fma(auVar53,ZEXT1632(auVar7),ZEXT1632(auVar41));
      local_2540._0_4_ = (float)((uint)fVar64 ^ auVar41._0_4_);
      local_2540._4_4_ = (float)((uint)fVar66 ^ auVar41._4_4_);
      local_2540._8_4_ = (float)((uint)fVar67 ^ auVar41._8_4_);
      local_2540._12_4_ = (float)((uint)fVar68 ^ auVar41._12_4_);
      local_2540._16_4_ = fVar78;
      local_2540._20_4_ = fVar79;
      local_2540._24_4_ = fVar80;
      local_2540._28_4_ = fVar81;
      uVar59 = *(undefined4 *)(ray + k * 4 + 0x30);
      auVar20._4_4_ = uVar59;
      auVar20._0_4_ = uVar59;
      auVar20._8_4_ = uVar59;
      auVar20._12_4_ = uVar59;
      auVar20._16_4_ = uVar59;
      auVar20._20_4_ = uVar59;
      auVar20._24_4_ = uVar59;
      auVar20._28_4_ = uVar59;
      auVar42 = vmulps_avx512vl(local_2520,auVar20);
      uVar18 = vcmpps_avx512vl(auVar42,local_2540,1);
      fVar3 = *(float *)(ray + k * 4 + 0x80);
      auVar63 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3,CONCAT420(fVar3,CONCAT416(fVar3,CONCAT412(
                                                  fVar3,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))))))));
      auVar22._4_4_ = fVar3 * fVar66;
      auVar22._0_4_ = fVar3 * fVar64;
      auVar22._8_4_ = fVar3 * fVar67;
      auVar22._12_4_ = fVar3 * fVar68;
      auVar22._16_4_ = fVar3 * fVar78;
      auVar22._20_4_ = fVar3 * fVar79;
      auVar22._24_4_ = fVar3 * fVar80;
      auVar22._28_4_ = auVar42._28_4_;
      uVar15 = vcmpps_avx512vl(local_2540,auVar22,2);
      local_24a0 = (byte)uVar18 & (byte)uVar15 & local_24a0;
      if (local_24a0 != 0) {
        local_2500 = ZEXT1632(auVar7);
        local_24e0 = ZEXT1632(auVar5);
        local_24c0 = ZEXT1632(auVar6);
        local_23c0 = 0xf0;
        local_27e0 = context->scene;
        auVar42 = vrcp14ps_avx512vl(local_2520);
        auVar76._8_4_ = 0x3f800000;
        auVar76._0_8_ = 0x3f8000003f800000;
        auVar76._12_4_ = 0x3f800000;
        auVar76._16_4_ = 0x3f800000;
        auVar76._20_4_ = 0x3f800000;
        auVar76._24_4_ = 0x3f800000;
        auVar76._28_4_ = 0x3f800000;
        auVar41 = vfnmadd213ps_fma(local_2520,auVar42,auVar76);
        auVar41 = vfmadd132ps_fma(ZEXT1632(auVar41),auVar42,auVar42);
        fVar64 = auVar41._0_4_;
        fVar66 = auVar41._4_4_;
        local_2440._4_4_ = fVar66 * local_2540._4_4_;
        local_2440._0_4_ = fVar64 * local_2540._0_4_;
        fVar67 = auVar41._8_4_;
        local_2440._8_4_ = fVar67 * local_2540._8_4_;
        fVar68 = auVar41._12_4_;
        local_2440._12_4_ = fVar68 * local_2540._12_4_;
        local_2440._16_4_ = fVar78 * 0.0;
        local_2440._20_4_ = fVar79 * 0.0;
        local_2440._24_4_ = fVar80 * 0.0;
        local_2440._28_4_ = auVar42._28_4_;
        auVar74 = ZEXT3264(local_2440);
        auVar23._4_4_ = fVar66 * local_2580._4_4_;
        auVar23._0_4_ = fVar64 * local_2580._0_4_;
        auVar23._8_4_ = fVar67 * local_2580._8_4_;
        auVar23._12_4_ = fVar68 * local_2580._12_4_;
        auVar23._16_4_ = fVar78 * 0.0;
        auVar23._20_4_ = fVar79 * 0.0;
        auVar23._24_4_ = fVar80 * 0.0;
        auVar23._28_4_ = fVar81;
        auVar42 = vminps_avx(auVar23,auVar76);
        auVar65._0_4_ = fVar64 * local_2560._0_4_;
        auVar65._4_4_ = fVar66 * local_2560._4_4_;
        auVar65._8_4_ = fVar67 * local_2560._8_4_;
        auVar65._12_4_ = fVar68 * local_2560._12_4_;
        auVar65._16_4_ = fVar78 * 0.0;
        auVar65._20_4_ = fVar79 * 0.0;
        auVar65._24_4_ = fVar80 * 0.0;
        auVar65._28_4_ = 0;
        auVar43 = vminps_avx(auVar65,auVar76);
        auVar44 = vsubps_avx(auVar76,auVar42);
        auVar45 = vsubps_avx(auVar76,auVar43);
        local_2460 = vblendps_avx(auVar43,auVar44,0xf0);
        local_2480 = vblendps_avx(auVar42,auVar45,0xf0);
        fVar64 = (float)DAT_01fbac00;
        local_2420._0_4_ = auVar7._0_4_ * fVar64;
        fVar66 = DAT_01fbac00._4_4_;
        local_2420._4_4_ = auVar7._4_4_ * fVar66;
        fVar67 = DAT_01fbac00._8_4_;
        local_2420._8_4_ = auVar7._8_4_ * fVar67;
        fVar68 = DAT_01fbac00._12_4_;
        local_2420._12_4_ = auVar7._12_4_ * fVar68;
        fVar78 = DAT_01fbac00._16_4_;
        local_2420._16_4_ = fVar78 * 0.0;
        fVar79 = DAT_01fbac00._20_4_;
        local_2420._20_4_ = fVar79 * 0.0;
        fVar80 = DAT_01fbac00._24_4_;
        local_2420._24_4_ = fVar80 * 0.0;
        local_2420._28_4_ = 0;
        local_2400._0_4_ = auVar5._0_4_ * fVar64;
        local_2400._4_4_ = auVar5._4_4_ * fVar66;
        local_2400._8_4_ = auVar5._8_4_ * fVar67;
        local_2400._12_4_ = auVar5._12_4_ * fVar68;
        local_2400._16_4_ = fVar78 * 0.0;
        local_2400._20_4_ = fVar79 * 0.0;
        local_2400._24_4_ = fVar80 * 0.0;
        local_2400._28_4_ = 0;
        local_23e0._4_4_ = auVar6._4_4_ * fVar66;
        local_23e0._0_4_ = auVar6._0_4_ * fVar64;
        local_23e0._8_4_ = auVar6._8_4_ * fVar67;
        local_23e0._12_4_ = auVar6._12_4_ * fVar68;
        local_23e0._16_4_ = fVar78 * 0.0;
        local_23e0._20_4_ = fVar79 * 0.0;
        local_23e0._24_4_ = fVar80 * 0.0;
        local_23e0._28_4_ = 0;
        auVar60._8_4_ = 0x7f800000;
        auVar60._0_8_ = 0x7f8000007f800000;
        auVar60._12_4_ = 0x7f800000;
        auVar60._16_4_ = 0x7f800000;
        auVar60._20_4_ = 0x7f800000;
        auVar60._24_4_ = 0x7f800000;
        auVar60._28_4_ = 0x7f800000;
        auVar42 = vblendmps_avx512vl(auVar60,local_2440);
        auVar57._0_4_ =
             (uint)(local_24a0 & 1) * auVar42._0_4_ | (uint)!(bool)(local_24a0 & 1) * 0x7f800000;
        bVar39 = (bool)(local_24a0 >> 1 & 1);
        auVar57._4_4_ = (uint)bVar39 * auVar42._4_4_ | (uint)!bVar39 * 0x7f800000;
        bVar39 = (bool)(local_24a0 >> 2 & 1);
        auVar57._8_4_ = (uint)bVar39 * auVar42._8_4_ | (uint)!bVar39 * 0x7f800000;
        bVar39 = (bool)(local_24a0 >> 3 & 1);
        auVar57._12_4_ = (uint)bVar39 * auVar42._12_4_ | (uint)!bVar39 * 0x7f800000;
        bVar39 = (bool)(local_24a0 >> 4 & 1);
        auVar57._16_4_ = (uint)bVar39 * auVar42._16_4_ | (uint)!bVar39 * 0x7f800000;
        bVar39 = (bool)(local_24a0 >> 5 & 1);
        auVar57._20_4_ = (uint)bVar39 * auVar42._20_4_ | (uint)!bVar39 * 0x7f800000;
        bVar39 = (bool)(local_24a0 >> 6 & 1);
        auVar57._24_4_ = (uint)bVar39 * auVar42._24_4_ | (uint)!bVar39 * 0x7f800000;
        auVar57._28_4_ =
             (uint)(local_24a0 >> 7) * auVar42._28_4_ | (uint)!(bool)(local_24a0 >> 7) * 0x7f800000;
        auVar42 = vshufps_avx(auVar57,auVar57,0xb1);
        auVar42 = vminps_avx(auVar57,auVar42);
        auVar43 = vshufpd_avx(auVar42,auVar42,5);
        auVar42 = vminps_avx(auVar42,auVar43);
        auVar43 = vpermpd_avx2(auVar42,0x4e);
        auVar42 = vminps_avx(auVar42,auVar43);
        uVar18 = vcmpps_avx512vl(auVar57,auVar42,0);
        uVar26 = (uint)local_24a0;
        bVar30 = local_24a0;
        if (((byte)uVar18 & local_24a0) != 0) {
          bVar30 = (byte)uVar18 & local_24a0;
        }
        uVar32 = 0;
        for (uVar31 = (uint)bVar30; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x80000000) {
          uVar32 = uVar32 + 1;
        }
        do {
          uVar34 = uVar32 & 0xff;
          uVar31 = *(uint *)((long)&local_25a0 + (ulong)uVar34 * 4);
          pGVar8 = (local_27e0->geometries).items[uVar31].ptr;
          local_2838 = (byte)uVar26;
          if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            uVar26 = (uint)(~(byte)(1 << (uVar32 & 0x1f)) & local_2838);
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar40 = (ulong)(uVar34 << 2);
              uVar59 = *(undefined4 *)(local_2480 + uVar40);
              uVar4 = *(undefined4 *)(local_2460 + uVar40);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar40);
              *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2420 + uVar40);
              *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2400 + uVar40);
              *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_23e0 + uVar40);
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar59;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_2760 + uVar40);
              *(uint *)(ray + k * 4 + 0x120) = uVar31;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              break;
            }
            local_26a0 = auVar74._0_32_;
            local_27a0 = auVar63._0_32_;
            local_2680 = vmovdqa64_avx512vl(auVar90._0_32_);
            local_2660 = auVar89._0_32_;
            local_2640 = auVar88._0_32_;
            local_2620 = auVar87._0_32_;
            local_2600 = auVar85._0_32_;
            local_25e0 = auVar84._0_32_;
            local_25c0 = auVar83._0_32_;
            uVar40 = (ulong)(uVar34 * 4);
            uVar59 = *(undefined4 *)(local_2480 + uVar40);
            local_2700._4_4_ = uVar59;
            local_2700._0_4_ = uVar59;
            local_2700._8_4_ = uVar59;
            local_2700._12_4_ = uVar59;
            local_26f0 = *(undefined4 *)(local_2460 + uVar40);
            local_26d0 = vpbroadcastd_avx512vl();
            uVar59 = *(undefined4 *)((long)&local_2760 + uVar40);
            local_26e0._4_4_ = uVar59;
            local_26e0._0_4_ = uVar59;
            local_26e0._8_4_ = uVar59;
            local_26e0._12_4_ = uVar59;
            uVar59 = *(undefined4 *)(local_2420 + uVar40);
            uVar4 = *(undefined4 *)(local_2400 + uVar40);
            local_2720._4_4_ = uVar4;
            local_2720._0_4_ = uVar4;
            local_2720._8_4_ = uVar4;
            local_2720._12_4_ = uVar4;
            uVar4 = *(undefined4 *)(local_23e0 + uVar40);
            local_2710._4_4_ = uVar4;
            local_2710._0_4_ = uVar4;
            local_2710._8_4_ = uVar4;
            local_2710._12_4_ = uVar4;
            local_2730[0] = (RTCHitN)(char)uVar59;
            local_2730[1] = (RTCHitN)(char)((uint)uVar59 >> 8);
            local_2730[2] = (RTCHitN)(char)((uint)uVar59 >> 0x10);
            local_2730[3] = (RTCHitN)(char)((uint)uVar59 >> 0x18);
            local_2730[4] = (RTCHitN)(char)uVar59;
            local_2730[5] = (RTCHitN)(char)((uint)uVar59 >> 8);
            local_2730[6] = (RTCHitN)(char)((uint)uVar59 >> 0x10);
            local_2730[7] = (RTCHitN)(char)((uint)uVar59 >> 0x18);
            local_2730[8] = (RTCHitN)(char)uVar59;
            local_2730[9] = (RTCHitN)(char)((uint)uVar59 >> 8);
            local_2730[10] = (RTCHitN)(char)((uint)uVar59 >> 0x10);
            local_2730[0xb] = (RTCHitN)(char)((uint)uVar59 >> 0x18);
            local_2730[0xc] = (RTCHitN)(char)uVar59;
            local_2730[0xd] = (RTCHitN)(char)((uint)uVar59 >> 8);
            local_2730[0xe] = (RTCHitN)(char)((uint)uVar59 >> 0x10);
            local_2730[0xf] = (RTCHitN)(char)((uint)uVar59 >> 0x18);
            uStack_26ec = local_26f0;
            uStack_26e8 = local_26f0;
            uStack_26e4 = local_26f0;
            vpcmpeqd_avx2(ZEXT1632(local_2700),ZEXT1632(local_2700));
            uStack_26bc = context->user->instID[0];
            local_26c0 = uStack_26bc;
            uStack_26b8 = uStack_26bc;
            uStack_26b4 = uStack_26bc;
            uStack_26b0 = context->user->instPrimID[0];
            uStack_26ac = uStack_26b0;
            uStack_26a8 = uStack_26b0;
            uStack_26a4 = uStack_26b0;
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar40);
            auVar41 = auVar91._0_16_;
            local_2810 = vmovdqa64_avx512vl(auVar41);
            local_27d0.valid = (int *)local_2810;
            local_27d0.geometryUserPtr = pGVar8->userPtr;
            local_27d0.context = context->user;
            local_27d0.hit = local_2730;
            local_27d0.N = 4;
            local_2770 = vmovdqa64_avx512vl(auVar41);
            auVar41 = vmovdqa64_avx512vl(auVar41);
            local_27d0.ray = (RTCRayN *)ray;
            if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar8->intersectionFilterN)(&local_27d0);
              auVar41 = local_2810;
            }
            uVar40 = vptestmd_avx512vl(auVar41,auVar41);
            if ((uVar40 & 0xf) == 0) {
LAB_01da5d43:
              *(undefined4 *)(ray + k * 4 + 0x80) = local_27a0._0_4_;
            }
            else {
              p_Var9 = context->args->filter;
              if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                (*p_Var9)(&local_27d0);
                auVar41 = local_2810;
              }
              uVar40 = vptestmd_avx512vl(auVar41,auVar41);
              uVar40 = uVar40 & 0xf;
              bVar30 = (byte)uVar40;
              if (bVar30 == 0) goto LAB_01da5d43;
              iVar2 = *(int *)(local_27d0.hit + 4);
              iVar24 = *(int *)(local_27d0.hit + 8);
              iVar25 = *(int *)(local_27d0.hit + 0xc);
              bVar39 = (bool)((byte)(uVar40 >> 1) & 1);
              bVar10 = (bool)((byte)(uVar40 >> 2) & 1);
              bVar11 = SUB81(uVar40 >> 3,0);
              *(uint *)(local_27d0.ray + 0xc0) =
                   (uint)(bVar30 & 1) * *(int *)local_27d0.hit |
                   (uint)!(bool)(bVar30 & 1) * *(int *)(local_27d0.ray + 0xc0);
              *(uint *)(local_27d0.ray + 0xc4) =
                   (uint)bVar39 * iVar2 | (uint)!bVar39 * *(int *)(local_27d0.ray + 0xc4);
              *(uint *)(local_27d0.ray + 200) =
                   (uint)bVar10 * iVar24 | (uint)!bVar10 * *(int *)(local_27d0.ray + 200);
              *(uint *)(local_27d0.ray + 0xcc) =
                   (uint)bVar11 * iVar25 | (uint)!bVar11 * *(int *)(local_27d0.ray + 0xcc);
              iVar2 = *(int *)(local_27d0.hit + 0x14);
              iVar24 = *(int *)(local_27d0.hit + 0x18);
              iVar25 = *(int *)(local_27d0.hit + 0x1c);
              bVar39 = (bool)((byte)(uVar40 >> 1) & 1);
              bVar10 = (bool)((byte)(uVar40 >> 2) & 1);
              bVar11 = SUB81(uVar40 >> 3,0);
              *(uint *)(local_27d0.ray + 0xd0) =
                   (uint)(bVar30 & 1) * *(int *)(local_27d0.hit + 0x10) |
                   (uint)!(bool)(bVar30 & 1) * *(int *)(local_27d0.ray + 0xd0);
              *(uint *)(local_27d0.ray + 0xd4) =
                   (uint)bVar39 * iVar2 | (uint)!bVar39 * *(int *)(local_27d0.ray + 0xd4);
              *(uint *)(local_27d0.ray + 0xd8) =
                   (uint)bVar10 * iVar24 | (uint)!bVar10 * *(int *)(local_27d0.ray + 0xd8);
              *(uint *)(local_27d0.ray + 0xdc) =
                   (uint)bVar11 * iVar25 | (uint)!bVar11 * *(int *)(local_27d0.ray + 0xdc);
              iVar2 = *(int *)(local_27d0.hit + 0x24);
              iVar24 = *(int *)(local_27d0.hit + 0x28);
              iVar25 = *(int *)(local_27d0.hit + 0x2c);
              bVar39 = (bool)((byte)(uVar40 >> 1) & 1);
              bVar10 = (bool)((byte)(uVar40 >> 2) & 1);
              bVar11 = SUB81(uVar40 >> 3,0);
              *(uint *)(local_27d0.ray + 0xe0) =
                   (uint)(bVar30 & 1) * *(int *)(local_27d0.hit + 0x20) |
                   (uint)!(bool)(bVar30 & 1) * *(int *)(local_27d0.ray + 0xe0);
              *(uint *)(local_27d0.ray + 0xe4) =
                   (uint)bVar39 * iVar2 | (uint)!bVar39 * *(int *)(local_27d0.ray + 0xe4);
              *(uint *)(local_27d0.ray + 0xe8) =
                   (uint)bVar10 * iVar24 | (uint)!bVar10 * *(int *)(local_27d0.ray + 0xe8);
              *(uint *)(local_27d0.ray + 0xec) =
                   (uint)bVar11 * iVar25 | (uint)!bVar11 * *(int *)(local_27d0.ray + 0xec);
              iVar2 = *(int *)(local_27d0.hit + 0x34);
              iVar24 = *(int *)(local_27d0.hit + 0x38);
              iVar25 = *(int *)(local_27d0.hit + 0x3c);
              bVar39 = (bool)((byte)(uVar40 >> 1) & 1);
              bVar10 = (bool)((byte)(uVar40 >> 2) & 1);
              bVar11 = SUB81(uVar40 >> 3,0);
              *(uint *)(local_27d0.ray + 0xf0) =
                   (uint)(bVar30 & 1) * *(int *)(local_27d0.hit + 0x30) |
                   (uint)!(bool)(bVar30 & 1) * *(int *)(local_27d0.ray + 0xf0);
              *(uint *)(local_27d0.ray + 0xf4) =
                   (uint)bVar39 * iVar2 | (uint)!bVar39 * *(int *)(local_27d0.ray + 0xf4);
              *(uint *)(local_27d0.ray + 0xf8) =
                   (uint)bVar10 * iVar24 | (uint)!bVar10 * *(int *)(local_27d0.ray + 0xf8);
              *(uint *)(local_27d0.ray + 0xfc) =
                   (uint)bVar11 * iVar25 | (uint)!bVar11 * *(int *)(local_27d0.ray + 0xfc);
              iVar2 = *(int *)(local_27d0.hit + 0x44);
              iVar24 = *(int *)(local_27d0.hit + 0x48);
              iVar25 = *(int *)(local_27d0.hit + 0x4c);
              bVar39 = (bool)((byte)(uVar40 >> 1) & 1);
              bVar10 = (bool)((byte)(uVar40 >> 2) & 1);
              bVar11 = SUB81(uVar40 >> 3,0);
              *(uint *)(local_27d0.ray + 0x100) =
                   (uint)(bVar30 & 1) * *(int *)(local_27d0.hit + 0x40) |
                   (uint)!(bool)(bVar30 & 1) * *(int *)(local_27d0.ray + 0x100);
              *(uint *)(local_27d0.ray + 0x104) =
                   (uint)bVar39 * iVar2 | (uint)!bVar39 * *(int *)(local_27d0.ray + 0x104);
              *(uint *)(local_27d0.ray + 0x108) =
                   (uint)bVar10 * iVar24 | (uint)!bVar10 * *(int *)(local_27d0.ray + 0x108);
              *(uint *)(local_27d0.ray + 0x10c) =
                   (uint)bVar11 * iVar25 | (uint)!bVar11 * *(int *)(local_27d0.ray + 0x10c);
              auVar41 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_27d0.hit + 0x50));
              *(undefined1 (*) [16])(local_27d0.ray + 0x110) = auVar41;
              auVar41 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_27d0.hit + 0x60));
              *(undefined1 (*) [16])(local_27d0.ray + 0x120) = auVar41;
              auVar41 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_27d0.hit + 0x70));
              *(undefined1 (*) [16])(local_27d0.ray + 0x130) = auVar41;
              auVar41 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_27d0.hit + 0x80));
              *(undefined1 (*) [16])(local_27d0.ray + 0x140) = auVar41;
              local_27a0 = ZEXT432(*(uint *)(ray + k * 4 + 0x80));
            }
            auVar63 = ZEXT3264(local_27a0);
            uVar59 = local_27a0._0_4_;
            auVar62._4_4_ = uVar59;
            auVar62._0_4_ = uVar59;
            auVar62._8_4_ = uVar59;
            auVar62._12_4_ = uVar59;
            auVar62._16_4_ = uVar59;
            auVar62._20_4_ = uVar59;
            auVar62._24_4_ = uVar59;
            auVar62._28_4_ = uVar59;
            auVar74 = ZEXT3264(local_26a0);
            uVar18 = vcmpps_avx512vl(local_26a0,auVar62,2);
            uVar26 = (uint)(~(byte)(1 << (uVar32 & 0x1f)) & local_2838) & (uint)uVar18;
            auVar83 = ZEXT3264(local_25c0);
            auVar84 = ZEXT3264(local_25e0);
            auVar85 = ZEXT3264(local_2600);
            auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar86 = ZEXT3264(auVar42);
            auVar87 = ZEXT3264(local_2620);
            auVar88 = ZEXT3264(local_2640);
            auVar89 = ZEXT3264(local_2660);
            auVar42 = vmovdqa64_avx512vl(local_2680);
            auVar90 = ZEXT3264(auVar42);
            auVar41 = vmovdqa64_avx512vl(local_2770);
            auVar91 = ZEXT1664(auVar41);
            auVar42 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
            auVar92 = ZEXT3264(auVar42);
            auVar42 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
            auVar93 = ZEXT3264(auVar42);
            auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
            auVar94 = ZEXT1664(auVar41);
          }
          bVar30 = (byte)uVar26;
          if (bVar30 == 0) break;
          auVar61._8_4_ = 0x7f800000;
          auVar61._0_8_ = 0x7f8000007f800000;
          auVar61._12_4_ = 0x7f800000;
          auVar61._16_4_ = 0x7f800000;
          auVar61._20_4_ = 0x7f800000;
          auVar61._24_4_ = 0x7f800000;
          auVar61._28_4_ = 0x7f800000;
          auVar42 = vblendmps_avx512vl(auVar61,auVar74._0_32_);
          auVar58._0_4_ =
               (uint)(bVar30 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar30 & 1) * 0x7f800000;
          bVar39 = (bool)((byte)(uVar26 >> 1) & 1);
          auVar58._4_4_ = (uint)bVar39 * auVar42._4_4_ | (uint)!bVar39 * 0x7f800000;
          bVar39 = (bool)((byte)(uVar26 >> 2) & 1);
          auVar58._8_4_ = (uint)bVar39 * auVar42._8_4_ | (uint)!bVar39 * 0x7f800000;
          bVar39 = (bool)((byte)(uVar26 >> 3) & 1);
          auVar58._12_4_ = (uint)bVar39 * auVar42._12_4_ | (uint)!bVar39 * 0x7f800000;
          bVar39 = (bool)((byte)(uVar26 >> 4) & 1);
          auVar58._16_4_ = (uint)bVar39 * auVar42._16_4_ | (uint)!bVar39 * 0x7f800000;
          bVar39 = (bool)((byte)(uVar26 >> 5) & 1);
          auVar58._20_4_ = (uint)bVar39 * auVar42._20_4_ | (uint)!bVar39 * 0x7f800000;
          bVar39 = (bool)((byte)(uVar26 >> 6) & 1);
          auVar58._24_4_ = (uint)bVar39 * auVar42._24_4_ | (uint)!bVar39 * 0x7f800000;
          auVar58._28_4_ = (uVar26 >> 7) * auVar42._28_4_ | (uint)!SUB41(uVar26 >> 7,0) * 0x7f800000
          ;
          auVar42 = vshufps_avx(auVar58,auVar58,0xb1);
          auVar42 = vminps_avx(auVar58,auVar42);
          auVar43 = vshufpd_avx(auVar42,auVar42,5);
          auVar42 = vminps_avx(auVar42,auVar43);
          auVar43 = vpermpd_avx2(auVar42,0x4e);
          auVar42 = vminps_avx(auVar42,auVar43);
          uVar18 = vcmpps_avx512vl(auVar58,auVar42,0);
          bVar30 = (byte)uVar18 & bVar30;
          uVar31 = uVar26;
          if (bVar30 != 0) {
            uVar31 = (uint)bVar30;
          }
          uVar32 = 0;
          for (; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x80000000) {
            uVar32 = uVar32 + 1;
          }
        } while( true );
      }
    }
  }
  uVar59 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar63 = ZEXT3264(CONCAT428(uVar59,CONCAT424(uVar59,CONCAT420(uVar59,CONCAT416(uVar59,CONCAT412(
                                                  uVar59,CONCAT48(uVar59,CONCAT44(uVar59,uVar59)))))
                                               )));
  goto LAB_01da52f4;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }